

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
libcellml::Validator::ValidatorImpl::handleErrorsFromImports
          (ValidatorImpl *this,size_t initialErrorCount,bool isOriginatingModel,string *type,
          string *name,History *history,ComponentPtr *component,UnitsPtr *units)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  AnyCellmlElementImpl *this_01;
  IssueImpl *pIVar3;
  char cVar4;
  long *plVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ostream *poVar9;
  long lVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  IssuePtr issue;
  string description;
  Strings ss;
  ostringstream os;
  string local_260;
  long local_240;
  string *local_238;
  undefined4 local_22c;
  Logger local_228;
  string local_218;
  string local_1f8;
  History *local_1d8;
  size_t local_1d0;
  string *local_1c8;
  Strings local_1c0;
  long *local_1a8;
  size_t local_1a0;
  long local_198 [12];
  ios_base local_138 [264];
  
  local_22c = (undefined4)CONCAT71(in_register_00000011,isOriginatingModel);
  local_238 = type;
  local_1d8 = history;
  local_1c8 = name;
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::skipThis_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::skipThis_abi_cxx11_), iVar6 != 0)) {
    handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
    ::skipThis_abi_cxx11_._M_dataplus._M_p =
         (pointer)&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                   ::skipThis_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::skipThis_abi_cxx11_,"Cyclic dependencies","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::skipThis_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::skipThis_abi_cxx11_);
  }
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::notOriginMarker_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::notOriginMarker_abi_cxx11_), iVar6 != 0)) {
    handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
    ::notOriginMarker_abi_cxx11_._M_dataplus._M_p =
         (pointer)&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                   ::notOriginMarker_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::notOriginMarker_abi_cxx11_,"NOT ORIGIN: ","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::notOriginMarker_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::notOriginMarker_abi_cxx11_);
  }
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::dataBoundaryMarker_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::dataBoundaryMarker_abi_cxx11_), iVar6 != 0)) {
    handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
    ::dataBoundaryMarker_abi_cxx11_._M_dataplus._M_p =
         (pointer)&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                   ::dataBoundaryMarker_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::dataBoundaryMarker_abi_cxx11_,"&","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::dataBoundaryMarker_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::dataBoundaryMarker_abi_cxx11_);
  }
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::dataSeparator_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::dataSeparator_abi_cxx11_), iVar6 != 0)) {
    handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
    ::dataSeparator_abi_cxx11_._M_dataplus._M_p =
         (pointer)&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                   ::dataSeparator_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::dataSeparator_abi_cxx11_,";","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::dataSeparator_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::dataSeparator_abi_cxx11_);
  }
  sVar7 = Logger::issueCount(&this->mValidator->super_Logger);
  if (initialErrorCount < sVar7) {
    do {
      Logger::issue(&local_228,(size_t)this->mValidator);
      Issue::description_abi_cxx11_(&local_218,(Issue *)local_228._vptr_Logger);
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_218);
      plVar5 = local_1a8;
      local_1d0 = initialErrorCount;
      if (local_1a0 ==
          handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
          ::skipThis_abi_cxx11_._M_string_length) {
        if (local_1a0 == 0) {
          bVar13 = false;
        }
        else {
          iVar6 = bcmp(local_1a8,
                       handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                       ::skipThis_abi_cxx11_._M_dataplus._M_p,local_1a0);
          bVar13 = iVar6 != 0;
        }
      }
      else {
        bVar13 = true;
      }
      if (plVar5 != local_198) {
        operator_delete(plVar5,local_198[0] + 1);
      }
      if (bVar13) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        if ((char)local_22c == '\0') {
          psVar1 = (local_1d8->
                   super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          peVar2 = psVar1[-1].
                   super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_00 = psVar1[-1].
                    super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,
                              handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                              ::notOriginMarker_abi_cxx11_._M_dataplus._M_p,
                              handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                              ::notOriginMarker_abi_cxx11_._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                     ::dataBoundaryMarker_abi_cxx11_._M_dataplus._M_p,
                              handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                              ::dataBoundaryMarker_abi_cxx11_._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(peVar2->mName)._M_dataplus._M_p,
                              (peVar2->mName)._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                     ::dataSeparator_abi_cxx11_._M_dataplus._M_p,
                              handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                              ::dataSeparator_abi_cxx11_._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(peVar2->mReferenceName)._M_dataplus._M_p,
                              (peVar2->mReferenceName)._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                     ::dataSeparator_abi_cxx11_._M_dataplus._M_p,
                              handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                              ::dataSeparator_abi_cxx11_._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(peVar2->mDestinationUrl)._M_dataplus._M_p,
                              (peVar2->mDestinationUrl)._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                     ::dataBoundaryMarker_abi_cxx11_._M_dataplus._M_p,
                              handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                              ::dataBoundaryMarker_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_218._M_dataplus._M_p,local_218._M_string_length);
          pIVar3 = *(IssueImpl **)((long)local_228._vptr_Logger + 8);
          std::__cxx11::stringbuf::str();
          Issue::IssueImpl::setDescription(pIVar3,&local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        else {
          uVar8 = std::__cxx11::string::find
                            ((char *)&local_218,
                             (ulong)handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                    ::notOriginMarker_abi_cxx11_._M_dataplus._M_p,0);
          if (uVar8 != 0xffffffffffffffff) {
            uVar11 = 1;
            do {
              if (uVar11 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"Imported ",9);
                iVar6 = std::__cxx11::string::compare((char *)local_238);
                pcVar12 = "units ";
                if (iVar6 == 0) {
                  pcVar12 = "component ";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,pcVar12,(ulong)(iVar6 == 0) * 4 + 6);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\'",1);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&local_1a8,(local_1c8->_M_dataplus)._M_p,
                                    local_1c8->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\' is not valid because:",0x17);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
              }
              lVar10 = std::__cxx11::string::find
                                 ((char *)&local_218,
                                  (ulong)handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataBoundaryMarker_abi_cxx11_._M_dataplus._M_p,uVar8);
              local_240 = std::__cxx11::string::find
                                    ((char *)&local_218,
                                     (ulong)handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                            ::dataBoundaryMarker_abi_cxx11_._M_dataplus._M_p,
                                     lVar10 + 1);
              std::__cxx11::string::substr((ulong)&local_260,(ulong)&local_218);
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,";","");
              split(&local_1c0,&local_260,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  -> ",5);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_1a8,(local_238->_M_dataplus)._M_p,
                                  local_238->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," \'",2);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,((local_1c0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p,
                                  (local_1c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\' importing \'",0xd);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_1c0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p,
                                  local_1c0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\' from \'",8);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_1c0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus.
                                         _M_p,
                                  local_1c0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
              uVar8 = std::__cxx11::string::find
                                ((char *)&local_218,
                                 (ulong)handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                        ::notOriginMarker_abi_cxx11_._M_dataplus._M_p,uVar8 + 1);
              cVar4 = (char)(ostringstream *)&local_1a8;
              if (uVar8 == 0xffffffffffffffff) {
                if (1 < uVar11) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8," which",6);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8," has an error:",0xe);
                std::ios::widen((char)local_1a8[-3] + cVar4);
                std::ostream::put(cVar4);
                poVar9 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   - ",5);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8," imports:",9);
                std::ios::widen((char)local_1a8[-3] + cVar4);
                std::ostream::put(cVar4);
                std::ostream::flush();
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              uVar11 = uVar11 + 1;
            } while (uVar8 != 0xffffffffffffffff);
            local_240 = local_240 + 1;
            if (uVar11 != 1) {
              iVar6 = std::__cxx11::string::compare((char *)local_238);
              this_01 = (((*(IssueImpl **)((long)local_228._vptr_Logger + 8))->mItem).
                         super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->mPimpl;
              if (iVar6 == 0) {
                AnyCellmlElement::AnyCellmlElementImpl::setComponent(this_01,component,COMPONENT);
              }
              else {
                AnyCellmlElement::AnyCellmlElementImpl::setUnits(this_01,units);
              }
            }
          }
          std::__cxx11::string::substr((ulong)&local_260,(ulong)&local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          pIVar3 = *(IssueImpl **)((long)local_228._vptr_Logger + 8);
          std::__cxx11::stringbuf::str();
          Issue::IssueImpl::setDescription(pIVar3,&local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      sVar7 = local_1d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_228.mPimpl != (LoggerImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228.mPimpl);
      }
      initialErrorCount = sVar7 + 1;
      sVar7 = Logger::issueCount(&this->mValidator->super_Logger);
    } while (initialErrorCount < sVar7);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::handleErrorsFromImports(size_t initialErrorCount, bool isOriginatingModel, const std::string &type, const std::string &name, const History &history, const ComponentPtr &component, const UnitsPtr &units) const
{
    static const std::string skipThis = "Cyclic dependencies";
    static const std::string notOriginMarker = "NOT ORIGIN: ";
    static const std::string dataBoundaryMarker = "&";
    static const std::string dataSeparator = ";";

    for (size_t i = initialErrorCount; i < mValidator->issueCount(); ++i) {
        auto issue = mValidator->issue(i);
        auto description = issue->description();
        if (description.substr(0, skipThis.length()) != skipThis) {
            std::ostringstream os;
            if (isOriginatingModel) {
                // If error is not from this model then set this component or units.
                size_t depth = 0;
                size_t pos = description.find(notOriginMarker);
                size_t originalDescriptionStart = 0;
                while (pos != std::string::npos) {
                    if (depth == 0) {
                        os << "Imported ";
                        if (type == "Component") {
                            os << "component ";
                        } else {
                            os << "units ";
                        }
                        os << "'" << name << "' is not valid because:" << std::endl;
                    }
                    size_t startMarker = description.find(dataBoundaryMarker, pos);
                    size_t endMarker = description.find(dataBoundaryMarker, startMarker + 1);
                    std::string importInfo = description.substr(startMarker + 1, endMarker - startMarker - 1);
                    auto ss = split(importInfo);
                    os << "  -> " << type << " '" << ss[0] << "' importing '" << ss[1] << "' from '" << ss[2] << "'";
                    originalDescriptionStart = endMarker + 1;
                    pos = description.find(notOriginMarker, pos + 1);
                    depth += 1;
                    if (pos == std::string::npos) {
                        if (depth > 1) {
                            os << " which";
                        }
                        os << " has an error:" << std::endl
                           << "   - ";
                    } else {
                        os << " imports:" << std::endl;
                    }
                }

                if (depth > 0) {
                    if (type == "Component") {
                        issue->mPimpl->mItem->mPimpl->setComponent(component);
                    } else {
                        issue->mPimpl->mItem->mPimpl->setUnits(units);
                    }
                }

                os << description.substr(originalDescriptionStart);
                issue->mPimpl->setDescription(os.str());
            } else {
                // Get name, reference, and import source from history.
                auto h = history.back();
                os << notOriginMarker << dataBoundaryMarker << h->mName << dataSeparator << h->mReferenceName << dataSeparator << h->mDestinationUrl << dataBoundaryMarker << description;
                issue->mPimpl->setDescription(os.str());
            }
        }
    }
}